

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O3

int Ivy_FraigMiterStatus(Ivy_Man_t *pMan)

{
  Ivy_Obj_t *pIVar1;
  uint uVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  
  if (pMan->pData != (void *)0x0) {
    return 0;
  }
  lVar3 = (long)pMan->vPos->nSize;
  if (lVar3 < 1) {
    return 1;
  }
  lVar6 = 0;
  iVar5 = 0;
  iVar4 = 0;
  do {
    pIVar1 = *(Ivy_Obj_t **)((long)pMan->vPos->pArray[lVar6] + 0x10);
    if (pIVar1 == pMan->pConst1) {
LAB_007962b6:
      iVar4 = iVar4 + 1;
    }
    else if (pIVar1 != (Ivy_Obj_t *)((ulong)pMan->pConst1 ^ 1)) {
      if ((((uint)pIVar1 ^ *(uint *)(((ulong)pIVar1 & 0xfffffffffffffffe) + 8) >> 7) & 1) != 0)
      goto LAB_007962b6;
      iVar5 = iVar5 + 1;
    }
    lVar6 = lVar6 + 1;
    if (lVar3 == lVar6) {
      uVar2 = -(uint)(iVar5 != 0) | 1;
      if (iVar4 != 0) {
        uVar2 = 0;
      }
      return uVar2;
    }
  } while( true );
}

Assistant:

int Ivy_FraigMiterStatus( Ivy_Man_t * pMan )
{
    Ivy_Obj_t * pObj, * pObjNew;
    int i, CountConst0 = 0, CountNonConst0 = 0, CountUndecided = 0;
    if ( pMan->pData )
        return 0;
    Ivy_ManForEachPo( pMan, pObj, i )
    {
        pObjNew = Ivy_ObjChild0(pObj);
        // check if the output is constant 1
        if ( pObjNew == pMan->pConst1 )
        {
            CountNonConst0++;
            continue;
        }
        // check if the output is constant 0
        if ( pObjNew == Ivy_Not(pMan->pConst1) )
        {
            CountConst0++;
            continue;
        }
/*
        // check if the output is a primary input
        if ( Ivy_ObjIsPi(Ivy_Regular(pObjNew)) )
        {
            CountNonConst0++;
            continue;
        }
*/
        // check if the output can be constant 0
        if ( Ivy_Regular(pObjNew)->fPhase != (unsigned)Ivy_IsComplement(pObjNew) )
        {
            CountNonConst0++;
            continue;
        }
        CountUndecided++;
    }
/*
    if ( p->pParams->fVerbose )
    {
        printf( "Miter has %d outputs. ", Ivy_ManPoNum(p->pManAig) );
        printf( "Const0 = %d.  ", CountConst0 );
        printf( "NonConst0 = %d.  ", CountNonConst0 );
        printf( "Undecided = %d.  ", CountUndecided );
        printf( "\n" );
    }
*/
    if ( CountNonConst0 )
        return 0;
    if ( CountUndecided )
        return -1;
    return 1;
}